

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lognormal_dist.hpp
# Opt level: O3

result_type_conflict1 __thiscall
trng::lognormal_dist<float>::pdf(lognormal_dist<float> *this,result_type_conflict1 x)

{
  float fVar1;
  result_type_conflict1 rVar2;
  float fVar3;
  
  rVar2 = 0.0;
  if (0.0 < x) {
    fVar3 = logf(x);
    fVar1 = (this->P).sigma_;
    fVar3 = (fVar3 - (this->P).mu_) / fVar1;
    fVar3 = expf(fVar3 * fVar3 * -0.5);
    rVar2 = fVar3 * (0.3989423 / (fVar1 * x));
  }
  return rVar2;
}

Assistant:

pdf(result_type x) const {
      if (x <= 0)
        return 0;
      result_type t((math::ln(x) - P.mu()) / P.sigma());
      return math::constants<result_type>::one_over_sqrt_2pi / (x * P.sigma()) *
             math::exp(-t * t / 2);
    }